

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

double __thiscall imrt::Station::intensityDown(Station *this,int i,int j)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  pointer ppVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  iterator it;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff98;
  int iVar6;
  _Rb_tree_iterator<std::pair<const_int,_int>_> *in_stack_ffffffffffffffa8;
  _Self local_30;
  int local_24;
  _Self local_20;
  int local_18;
  int local_14;
  double local_8;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),in_ESI,in_EDX);
  iVar6 = local_18;
  if (0.0 < *pdVar4) {
    if ((local_18 != 0) &&
       (iVar3 = maths::Matrix::nb_cols((Matrix *)(in_RDI + 0xb8)), iVar6 != iVar3)) {
      pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18 + -1);
      dVar1 = *pdVar4;
      pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
      if (*pdVar4 <= dVar1) {
        pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18 + 1);
        in_stack_ffffffffffffffa8 = (_Rb_tree_iterator<std::pair<const_int,_int>_> *)*pdVar4;
        pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
        if (*pdVar4 <= (double)in_stack_ffffffffffffffa8) {
          pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
          return *pdVar4;
        }
      }
    }
    iVar6 = (int)((ulong)(in_RDI + 0x140) >> 0x20);
    pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
    local_24 = (int)*pdVar4;
    local_20._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                   (in_stack_ffffffffffffff98,(key_type_conflict *)0x13fbc2);
    local_30._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   (in_stack_ffffffffffffff98);
    bVar2 = std::operator!=(&local_20,&local_30);
    if (bVar2) {
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator--
                (in_stack_ffffffffffffffa8,iVar6);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x13fc0d);
      local_8 = (double)ppVar5->first;
    }
    else {
      local_8 = 0.0;
    }
  }
  else {
    pdVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_14,local_18);
    local_8 = *pdVar4;
  }
  return local_8;
}

Assistant:

double Station::intensityDown(int i, int j){
    if(I(i,j)<=0) return I(i,j);
    if(j==0 || j==I.nb_cols() ||
        I(i,j-1)<I(i,j) || I(i,j+1)<I(i,j) ){
            //previous available intensity
            map< int, int >::iterator it = int2nb.find(I(i,j));
            if(it!=int2nb.begin()){
              it--; return it->first;
            }else
              return 0.0;
     }
    return I(i,j);
  }